

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_error.hpp
# Opt level: O1

char * __thiscall jsoncons::conv_error::what(conv_error *this)

{
  string *psVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  char cVar6;
  string __str;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  psVar1 = &this->what_;
  if ((this->what_)._M_string_length == 0) {
    std::runtime_error::what();
    std::__cxx11::string::append((char *)psVar1);
    if ((this->line_number_ == 0) || (this->column_number_ == 0)) {
      if (this->column_number_ == 0) goto LAB_00250904;
      std::__cxx11::string::append((char *)psVar1);
      uVar2 = this->column_number_;
      cVar6 = '\x01';
      if (9 < uVar2) {
        uVar5 = uVar2;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          if (uVar5 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_002508b2;
          }
          if (uVar5 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_002508b2;
          }
          if (uVar5 < 10000) goto LAB_002508b2;
          bVar3 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar4 = cVar6 + '\x04';
        } while (bVar3);
        cVar6 = cVar6 + '\x01';
      }
LAB_002508b2:
      local_40 = local_30;
      std::__cxx11::string::_M_construct((ulong)&local_40,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,uVar2);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40);
    }
    else {
      std::__cxx11::string::append((char *)psVar1);
      uVar2 = this->line_number_;
      cVar6 = '\x01';
      if (9 < uVar2) {
        uVar5 = uVar2;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          if (uVar5 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_002507bb;
          }
          if (uVar5 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_002507bb;
          }
          if (uVar5 < 10000) goto LAB_002507bb;
          bVar3 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar4 = cVar6 + '\x04';
        } while (bVar3);
        cVar6 = cVar6 + '\x01';
      }
LAB_002507bb:
      local_40 = local_30;
      std::__cxx11::string::_M_construct((ulong)&local_40,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,uVar2);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40);
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
      std::__cxx11::string::append((char *)psVar1);
      uVar2 = this->column_number_;
      cVar6 = '\x01';
      if (9 < uVar2) {
        uVar5 = uVar2;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          if (uVar5 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_0025087a;
          }
          if (uVar5 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_0025087a;
          }
          if (uVar5 < 10000) goto LAB_0025087a;
          bVar3 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar4 = cVar6 + '\x04';
        } while (bVar3);
        cVar6 = cVar6 + '\x01';
      }
LAB_0025087a:
      local_40 = local_30;
      std::__cxx11::string::_M_construct((ulong)&local_40,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,uVar2);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40);
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
LAB_00250904:
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::system_error::what());
                    if (line_number_ != 0 && column_number_ != 0)
                    {
                        what_.append(" at line ");
                        what_.append(std::to_string(line_number_));
                        what_.append(" and column ");
                        what_.append(std::to_string(column_number_));
                    }
                    else if (column_number_ != 0)
                    {
                        what_.append(" at position ");
                        what_.append(std::to_string(column_number_));
                    }
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::system_error::what();
                }
            }